

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_test.cpp
# Opt level: O1

void __thiscall Half_Basics_Test::TestBody(Half_Basics_Test *this)

{
  undefined1 auVar1 [16];
  bool bVar2;
  uint uVar3;
  float fVar4;
  int iVar5;
  char *pcVar6;
  uint uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  AssertionResult gtest_ar;
  Half h;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  AssertHelper local_50;
  internal local_48 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  Half local_32;
  
  local_58.ptr_ = local_58.ptr_ & 0xffffffffffff0000;
  testing::internal::CmpHelperEQ<unsigned_short,int>
            (local_48,"Half(0.f).Bits()","HalfPositiveZero",(unsigned_short *)&local_58,
             &pbrt::HalfPositiveZero);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_40.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_40.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/float_test.cpp"
               ,0x7e,pcVar6);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (local_58.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_58.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_58.ptr_ + 8))();
      }
      local_58.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_58.ptr_._0_2_ = 0x8000;
  testing::internal::CmpHelperEQ<unsigned_short,int>
            (local_48,"Half(-0.f).Bits()","HalfNegativeZero",(unsigned_short *)&local_58,
             &pbrt::HalfNegativeZero);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_40.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_40.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/float_test.cpp"
               ,0x7f,pcVar6);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (local_58.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_58.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_58.ptr_ + 8))();
      }
      local_58.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_58.ptr_._0_2_ = 0x7c00;
  testing::internal::CmpHelperEQ<unsigned_short,int>
            (local_48,"Half(Infinity).Bits()","HalfPositiveInfinity",(unsigned_short *)&local_58,
             &pbrt::HalfPositiveInfinity);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_40.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_40.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/float_test.cpp"
               ,0x80,pcVar6);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (local_58.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_58.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_58.ptr_ + 8))();
      }
      local_58.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_58.ptr_._0_2_ = 0xfc00;
  testing::internal::CmpHelperEQ<unsigned_short,int>
            (local_48,"Half(-Infinity).Bits()","HalfNegativeInfinity",(unsigned_short *)&local_58,
             &pbrt::HalfNegativeInfinity);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_40.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_40.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/float_test.cpp"
               ,0x81,pcVar6);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (local_58.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_58.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_58.ptr_ + 8))();
      }
      local_58.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_48[0] = (internal)0x1;
  local_40.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_48[0] = (internal)0x1;
  local_40.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_48[0] = (internal)0x1;
  local_40.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  uVar7 = 0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  do {
    local_32.h = (uint16_t)uVar7;
    if (((local_32.h & 0x7fff) != 0x7c00) && ((~uVar7 & 0x7c00) != 0 || (uVar7 & 0x3ff) == 0)) {
      local_58.ptr_._0_2_ = local_32.h;
      testing::internal::CmpHelperEQ<pbrt::Half,pbrt::Half>
                (local_48,"h","-(-h)",&local_32,(Half *)&local_58);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_58);
        pcVar6 = "";
        if (local_40.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar6 = ((local_40.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/float_test.cpp"
                   ,0x8b,pcVar6);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if (local_58.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) &&
             (local_58.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_58.ptr_ + 8))();
          }
          local_58.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_58.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (CONCAT62(local_58.ptr_._2_6_,local_32.h) ^ 0x8000);
      uVar3 = (uint)local_32.h << 0xd;
      if ((uVar3 & 0xf800000) == 0xf800000) {
        fVar4 = (float)(uVar3 | 0x70000000);
      }
      else if ((uVar3 & 0xf800000) == 0) {
        fVar4 = (float)(uVar3 | 0x38800000) + -6.1035156e-05;
      }
      else {
        fVar4 = (float)((uVar3 & 0xfffe000) + 0x38000000);
      }
      auVar8._8_4_ = 0x7fffffff;
      auVar8._0_8_ = 0x7fffffff7fffffff;
      auVar8._12_4_ = 0x7fffffff;
      auVar9 = ZEXT416((int)(short)local_32.h & 0x80000000U | (uint)fVar4);
      auVar8 = vpandd_avx512vl(auVar9,auVar8);
      fVar4 = auVar8._0_4_;
      if ((uint)fVar4 < 0x47800000) {
        if ((uint)fVar4 < 0x38800000) {
          local_50.data_._0_2_ = SUB42(fVar4 + 0.5,0);
        }
        else {
          local_50.data_._0_2_ =
               (ushort)((int)fVar4 + 0x8000fff + (uint)(((uint)fVar4 >> 0xd & 1) != 0) >> 0xd);
        }
      }
      else {
        local_50.data_._0_2_ = (0x7f800000 < (uint)fVar4 | 0x3e) << 9;
      }
      auVar1._8_4_ = 0x80000000;
      auVar1._0_8_ = 0x8000000080000000;
      auVar1._12_4_ = 0x80000000;
      auVar8 = vpxord_avx512vl(auVar9,auVar1);
      iVar5 = vmovmskps_avx(auVar8);
      local_50.data_._0_2_ = (ushort)(iVar5 << 0xf) | (ushort)local_50.data_;
      testing::internal::CmpHelperEQ<pbrt::Half,pbrt::Half>
                (local_48,"-h","Half(-float(h))",(Half *)&local_58,(Half *)&local_50);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_58);
        pcVar6 = "";
        if (local_40.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar6 = ((local_40.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/float_test.cpp"
                   ,0x8c,pcVar6);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if (local_58.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) &&
             (local_58.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_58.ptr_ + 8))();
          }
          local_58.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    uVar7 = uVar7 + 1;
  } while (uVar7 != 0x10000);
  return;
}

Assistant:

TEST(Half, Basics) {
    EXPECT_EQ(Half(0.f).Bits(), HalfPositiveZero);
    EXPECT_EQ(Half(-0.f).Bits(), HalfNegativeZero);
    EXPECT_EQ(Half(Infinity).Bits(), HalfPositiveInfinity);
    EXPECT_EQ(Half(-Infinity).Bits(), HalfNegativeInfinity);

    EXPECT_TRUE(Half(std::numeric_limits<Float>::quiet_NaN()).IsNaN());
    EXPECT_TRUE(Half(std::numeric_limits<Float>::quiet_NaN()).IsNaN());
    EXPECT_FALSE(Half::FromBits(HalfPositiveInfinity).IsNaN());

    for (uint32_t bits = 0; bits < 65536; ++bits) {
        Half h = Half::FromBits(bits);
        if (h.IsInf() || h.IsNaN())
            continue;
        EXPECT_EQ(h, -(-h));
        EXPECT_EQ(-h, Half(-float(h)));
    }
}